

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_functions.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  __mode_t __mask;
  ChStreamOutAscii *pCVar3;
  long *plVar4;
  ostream *poVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int i;
  int iVar7;
  int i_2;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ChFunction_MyTest f_test;
  string out_dir;
  shared_ptr<chrono::ChFunction_Repeat> f_rep_seq;
  string repeatfile;
  string seqfile;
  string testfile;
  string sinefile;
  ChFunction_Sequence f_sequence;
  ChFunction_Sine f_sine;
  ChStreamOutAsciiFile file_f_sine;
  ChStreamOutAsciiFile file_f_test;
  ChStreamOutAsciiFile file_f_repeat;
  ChStreamOutAsciiFile file_f_sequence;
  undefined **local_d90;
  string local_d88;
  ChFunction_Repeat *local_d68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d58;
  _func_int **local_d50;
  long *local_d48 [2];
  long local_d38 [2];
  long *local_d28 [2];
  long local_d18 [2];
  long *local_d08 [2];
  long local_cf8 [2];
  long *local_ce8 [2];
  long local_cd8 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_cc8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_cc0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_cb8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_cb0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_ca8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_ca0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c58;
  _func_int **local_c50;
  _List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> local_c48;
  undefined8 uStack_c30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c20;
  code *local_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 uStack_c00;
  undefined8 uStack_bf8;
  path local_bf0 [18];
  ChStreamOutAscii local_920 [32];
  string local_900 [22];
  ChStreamOutAscii local_630 [32];
  ChStreamOutAsciiFile local_610 [720];
  ChStreamOutAscii local_340 [32];
  ChStreamOutAsciiFile local_320 [720];
  ChStreamOutAscii local_50 [32];
  
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar3 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar3,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar3,"\n\n");
  plVar4 = (long *)chrono::GetChronoOutputPath_abi_cxx11_();
  local_d88._M_dataplus._M_p = (pointer)&local_d88.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d88,*plVar4,plVar4[1] + *plVar4);
  std::__cxx11::string::append((char *)&local_d88);
  filesystem::path::path(local_bf0,&local_d88);
  bVar2 = filesystem::path::is_directory(local_bf0);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_bf0[0].m_path);
  }
  else {
    __mask = umask(0);
    filesystem::path::str_abi_cxx11_(local_900,local_bf0,native_path);
    iVar7 = mkdir(local_900[0]._M_dataplus._M_p,0x1ff);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_900[0]._M_dataplus._M_p != &local_900[0].field_2) {
      operator_delete(local_900[0]._M_dataplus._M_p,local_900[0].field_2._M_allocated_capacity + 1);
    }
    umask(__mask);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_bf0[0].m_path);
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error creating directory ",0x19);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_d88._M_dataplus._M_p,
                          local_d88._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      iVar7 = 1;
      std::ostream::flush();
      goto LAB_001051c8;
    }
  }
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar3,"==== Test 1...\n\n");
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar3 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar3,"   ChFunction_Ramp at x=0: y=");
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,1.4000000000000001);
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,"  dy/dx=");
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,0.1);
  chrono::ChStreamOutAscii::operator<<(pCVar3,"\n\n");
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar3,"==== Test 2...\n\n");
  local_c18 = chrono::ChFunction::Compute_mean;
  local_c10 = 0x4000000000000000;
  uStack_c08 = 0;
  uStack_c00 = 0x3ff8000000000000;
  uStack_bf8 = 0x4022d97c7f3321d2;
  local_ce8[0] = local_cd8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_ce8,local_d88._M_dataplus._M_p,
             local_d88._M_dataplus._M_p + local_d88._M_string_length);
  std::__cxx11::string::append((char *)local_ce8);
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
            ((ChStreamOutAsciiFile *)local_bf0,(char *)local_ce8[0],_S_trunc);
  iVar7 = 0;
  do {
    dVar8 = (double)iVar7 / 50.0;
    dVar9 = (double)chrono::ChFunction_Sine::Get_y(dVar8);
    dVar10 = (double)chrono::ChFunction_Sine::Get_y_dx(dVar8);
    dVar11 = (double)chrono::ChFunction_Sine::Get_y_dxdx(dVar8);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_920,dVar8);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar9);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar10);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar11);
    chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
    iVar7 = iVar7 + 1;
  } while (iVar7 != 100);
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar3,"==== Test 3...\n\n");
  local_d90 = &PTR__ChFunction_00109a88;
  local_d08[0] = local_cf8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d08,local_d88._M_dataplus._M_p,
             local_d88._M_dataplus._M_p + local_d88._M_string_length);
  std::__cxx11::string::append((char *)local_d08);
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
            ((ChStreamOutAsciiFile *)local_900,(char *)local_d08[0],_S_trunc);
  iVar7 = 0;
  do {
    dVar8 = (double)iVar7 / 50.0;
    dVar9 = cos(dVar8);
    dVar10 = (double)(*(code *)local_d90[4])(&local_d90);
    dVar11 = (double)(*(code *)local_d90[4])(dVar8,&local_d90);
    dVar12 = (double)(*(code *)local_d90[5])(dVar8 + 1e-07,&local_d90);
    dVar13 = (double)(*(code *)local_d90[5])(dVar8,&local_d90);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_630,dVar8);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar9);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar3,(dVar10 - dVar11) / 1e-07);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar3,(dVar12 - dVar13) / 1e-07);
    chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
    iVar7 = iVar7 + 1;
  } while (iVar7 != 100);
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar3,"==== Test 4...\n\n");
  local_c48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c48;
  local_d50 = (_func_int **)std::ostream::flush;
  local_c50 = (_func_int **)std::ostream::flush;
  local_c48._M_impl._M_node._M_size = 0;
  uStack_c30 = 0;
  local_c48._M_impl._M_node.super__List_node_base._M_prev =
       local_c48._M_impl._M_node.super__List_node_base._M_next;
  local_cb8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  local_cb8->_M_use_count = 1;
  local_cb8->_M_weak_count = 1;
  local_cb8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109b80;
  local_c60 = local_cb8 + 1;
  local_cb8[1]._vptr__Sp_counted_base = (_func_int **)chrono::ChFunction::FileAsciiPairsSave;
  local_cb8[1]._M_use_count = 0x33333333;
  local_cb8[1]._M_weak_count = 0x3fd33333;
  local_cb8[2]._vptr__Sp_counted_base = (_func_int **)0x3fe0000000000000;
  local_cb8[2]._M_use_count = 0;
  local_cb8[2]._M_weak_count = 0x3fe00000;
  local_cb8[3]._vptr__Sp_counted_base = (_func_int **)0x3fe0000000000000;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_cb8->_M_use_count = local_cb8->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_cb8->_M_use_count = 2;
  }
  local_c58 = local_cb8;
  chrono::ChFunction_Sequence::InsertFunct(&local_c50,&local_c60,0,0,0,0);
  if (local_c58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c58);
  }
  local_cc0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_cc0->_M_use_count = 1;
  local_cc0->_M_weak_count = 1;
  local_cc0->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109c30;
  local_c70 = local_cc0 + 1;
  local_cc0[1]._vptr__Sp_counted_base = (_func_int **)chrono::ChFunction_Sine::Get_y_dxdx;
  local_cc0[1]._M_use_count = 0;
  local_cc0[1]._M_weak_count = 0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_cc0->_M_use_count = local_cc0->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_cc0->_M_use_count = 2;
  }
  local_c68 = local_cc0;
  chrono::ChFunction_Sequence::InsertFunct
            (0x3fd999999999999a,0x3ff0000000000000,&local_c50,&local_c70,1,0,0,0xffffffff);
  if (local_c68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c68);
  }
  local_cc8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  local_cc8->_M_use_count = 1;
  local_cc8->_M_weak_count = 1;
  local_cc8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109b80;
  local_c80 = local_cc8 + 1;
  local_cc8[1]._vptr__Sp_counted_base = (_func_int **)chrono::ChFunction::FileAsciiPairsSave;
  local_cc8[1]._M_use_count = -0x66666666;
  local_cc8[1]._M_weak_count = -0x40366667;
  local_cc8[2]._vptr__Sp_counted_base = (_func_int **)0x3fd3333333333333;
  local_cc8[2]._M_use_count = 0x66666666;
  local_cc8[2]._M_weak_count = 0x3fe66666;
  local_cc8[3]._vptr__Sp_counted_base = (_func_int **)0x3fe3333333333333;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_cc8->_M_use_count = local_cc8->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_cc8->_M_use_count = local_cc8->_M_use_count + 1;
  }
  local_c78 = local_cc8;
  chrono::ChFunction_Sequence::InsertFunct(&local_c50,&local_c80,1,0,0,0xffffffff);
  if (local_c78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c78);
  }
  chrono::ChFunction_Sequence::Setup();
  local_d28[0] = local_d18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d28,local_d88._M_dataplus._M_p,
             local_d88._M_dataplus._M_p + local_d88._M_string_length);
  std::__cxx11::string::append((char *)local_d28);
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(local_320,(char *)local_d28[0],_S_trunc);
  iVar7 = 0;
  do {
    dVar8 = (double)iVar7 / 50.0;
    dVar9 = (double)chrono::ChFunction_Sequence::Get_y(dVar8);
    dVar10 = (double)chrono::ChFunction_Sequence::Get_y_dx(dVar8);
    dVar11 = (double)chrono::ChFunction_Sequence::Get_y_dxdx(dVar8);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_50,dVar8);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar9);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar10);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar11);
    chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
    iVar7 = iVar7 + 1;
  } while (iVar7 != 100);
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar3,"==== Test 5...\n\n");
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109c80;
  p_Var6[1]._vptr__Sp_counted_base = (_func_int **)std::__throw_length_error;
  p_Var6[1]._M_use_count = 0;
  p_Var6[1]._M_weak_count = 0;
  p_Var6[2]._vptr__Sp_counted_base = (_func_int **)0x3fe0000000000000;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109c30;
  this[1]._vptr__Sp_counted_base = (_func_int **)chrono::ChFunction_Sine::Get_y_dxdx;
  this[1]._M_use_count = 0;
  this[1]._M_weak_count = 0x3ff00000;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109c80;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)std::__throw_length_error;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0xbfe0000000000000;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  local_c90 = p_Var6 + 1;
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109cd0;
  p_Var1 = this_01 + 1;
  this_01[1]._vptr__Sp_counted_base = local_d50;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)&this_01[1]._M_use_count;
  *(_Atomic_word **)&this_01[1]._M_use_count = &this_01[1]._M_use_count;
  this_01[2]._M_use_count = 0;
  this_01[2]._M_weak_count = 0;
  this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
  }
  local_c88 = p_Var6;
  chrono::ChFunction_Sequence::InsertFunct
            (0x3ff0000000000000,0x3ff0000000000000,p_Var1,&local_c90,1,0,0,0xffffffff);
  local_ca0 = this + 1;
  if (local_c88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c88);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  local_c98 = this;
  chrono::ChFunction_Sequence::InsertFunct
            (0x3ff0000000000000,0x3ff0000000000000,p_Var1,&local_ca0,1,0,0,0xffffffff);
  local_cb0 = this_00 + 1;
  if (local_c98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c98);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_ca8 = this_00;
  chrono::ChFunction_Sequence::InsertFunct
            (0x3ff0000000000000,0x3ff0000000000000,p_Var1,&local_cb0,1,0,0,0xffffffff);
  if (local_ca8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ca8);
  }
  local_d68 = (ChFunction_Repeat *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChFunction_Repeat,std::allocator<chrono::ChFunction_Repeat>>
            (&local_d60,&local_d68,(allocator<chrono::ChFunction_Repeat> *)local_610);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_d68 + 0x20) = p_Var1;
  local_c28 = p_Var1;
  local_c20._M_pi = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d68 + 0x28),&local_c20);
  if (local_c20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c20._M_pi);
  }
  *(long *)(local_d68 + 0x10) = 0x4008000000000000;
  *(long *)(local_d68 + 8) = 0;
  *(long *)(local_d68 + 0x18) = 0x4008000000000000;
  local_d48[0] = local_d38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d48,local_d88._M_dataplus._M_p,
             local_d88._M_dataplus._M_p + local_d88._M_string_length);
  std::__cxx11::string::append((char *)local_d48);
  local_d58 = p_Var6;
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(local_610,(char *)local_d48[0],_S_trunc);
  iVar7 = 0;
  do {
    dVar8 = (double)iVar7 / 50.0;
    dVar9 = (double)(**(code **)(*(long *)local_d68 + 0x20))();
    dVar10 = (double)(**(code **)(*(long *)local_d68 + 0x28))(dVar8);
    dVar11 = (double)(**(code **)(*(long *)local_d68 + 0x30))(dVar8);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_340,dVar8);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar9);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar10);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," ");
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dVar11);
    chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
    iVar7 = iVar7 + 1;
  } while (iVar7 != 1000);
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(local_610);
  if (local_d48[0] != local_d38) {
    operator_delete(local_d48[0],local_d38[0] + 1);
  }
  p_Var1 = local_d58;
  if (local_d60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d60._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(local_320);
  if (local_d28[0] != local_d18) {
    operator_delete(local_d28[0],local_d18[0] + 1);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cc8);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cc0);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cb8);
  local_c50 = local_d50;
  std::__cxx11::_List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>::_M_clear
            (&local_c48);
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_900);
  if (local_d08[0] != local_cf8) {
    operator_delete(local_d08[0],local_cf8[0] + 1);
  }
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_bf0);
  if (local_ce8[0] != local_cd8) {
    operator_delete(local_ce8[0],local_cd8[0] + 1);
  }
  iVar7 = 0;
LAB_001051c8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d88._M_dataplus._M_p != &local_d88.field_2) {
    operator_delete(local_d88._M_dataplus._M_p,local_d88.field_2._M_allocated_capacity + 1);
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    // Create (if needed) output directory
    const std::string out_dir = GetChronoOutputPath() + "DEMO_FUNCTIONS";
    if (!filesystem::create_directory(filesystem::path(out_dir))) {
        std::cout << "Error creating directory " << out_dir << std::endl;
        return 1;
    }

    //
    // EXAMPLE 1: create a ramp ChFunction, set properties, evaluate it.
    //

    GetLog() << "==== Test 1...\n\n";

    ChFunction_Ramp f_ramp;

    f_ramp.Set_ang(0.1);  // set angular coefficient;
    f_ramp.Set_y0(0.4);   // set y value for x=0;

    // Evaluate y=f(x) function at a given x value, using Get_y() :
    double y_ramp = f_ramp.Get_y(10);
    // Evaluate derivative df(x)/dx at a given x value, using Get_y_dx() :
    double ydx_ramp = f_ramp.Get_y_dx(10);

    GetLog() << "   ChFunction_Ramp at x=0: y=" << y_ramp << "  dy/dx=" << ydx_ramp << "\n\n";

    //
    // EXAMPLE 2: save values of a sine ChFunction  into a file
    //

    GetLog() << "==== Test 2...\n\n";

    ChFunction_Sine f_sine;

    f_sine.Set_amp(2);     // set amplitude;
    f_sine.Set_freq(1.5);  // set frequency;

    std::string sinefile = out_dir + "/f_sine_out.dat";
    ChStreamOutAsciiFile file_f_sine(sinefile.c_str());

    // Evaluate y=f(x) function along 100 x points, and its derivatives,
    // and save to file (later it can be loaded, for example, in Matlab using the 'load()' command)
    for (int i = 0; i < 100; i++) {
        double x = (double)i / 50.0;
        double y = f_sine.Get_y(x);
        double ydx = f_sine.Get_y_dx(x);
        double ydxdx = f_sine.Get_y_dxdx(x);
        file_f_sine << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    //
    // EXAMPLE 3: use a custom function (see class at the beginning of this file)
    //

    GetLog() << "==== Test 3...\n\n";

    // The following class will be used as an example of how
    // how you can create custom functions based on the ChFunction interface.
    // There is at least one mandatory member function to implement:  Get_y().
    // [Note that the base class implements a default computation of derivatives
    // Get_ydx() and Get_ydxdx() by using a numerical differentiation, however
    // if you know the analytical expression of derivatives, you can override
    // the base Get_ydx() and Get_ydxdx() too, for higher precision.]

    class ChFunction_MyTest : public ChFunction {
      public:
        virtual ChFunction_MyTest* Clone() const override { return new ChFunction_MyTest(); }

        virtual double Get_y(double x) const override { return cos(x); }  // just for test: simple cosine
    };

    ChFunction_MyTest f_test;

    std::string testfile = out_dir + "/f_test_out.dat";
    ChStreamOutAsciiFile file_f_test(testfile.c_str());

    // Evaluate y=f(x) function along 100 x points, and its derivatives,
    // and save to file (later it can be loaded, for example, in Matlab using the 'load()' command)
    for (int i = 0; i < 100; i++) {
        double x = (double)i / 50.0;
        double y = f_test.Get_y(x);
        double ydx = f_test.Get_y_dx(x);
        double ydxdx = f_test.Get_y_dxdx(x);
        file_f_test << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    //
    // EXAMPLE 4: mount some functions in a sequence using ChFunction_Sequence
    //

    GetLog() << "==== Test 4...\n\n";

    ChFunction_Sequence f_sequence;

    auto f_constacc1 = chrono_types::make_shared<ChFunction_ConstAcc>();
    f_constacc1->Set_end(0.5);  // length of ramp
    f_constacc1->Set_h(0.3);    // height of ramp
    f_sequence.InsertFunct(f_constacc1, 0.5, 1, false, false, false, 0);

    auto f_const = chrono_types::make_shared<ChFunction_Const>();
    f_sequence.InsertFunct(f_const, 0.4, 1, true, false, false, -1);

    auto f_constacc2 = chrono_types::make_shared<ChFunction_ConstAcc>();
    f_constacc2->Set_end(0.6);  // length of ramp
    f_constacc2->Set_av(0.3);   // acceleration ends after 30% length
    f_constacc2->Set_aw(0.7);   // deceleration starts after 70% length
    f_constacc2->Set_h(-0.2);   // height of ramp
    f_sequence.InsertFunct(f_constacc2, 0.6, 1, true, false, false, -1);

    f_sequence.Setup();

    std::string seqfile = out_dir + "/f_sequence_out.dat";
    ChStreamOutAsciiFile file_f_sequence(seqfile.c_str());

    // Evaluate y=f(x) function along 100 x points, and its derivatives,
    // and save to file (later it can be loaded, for example, in Matlab using the 'load()' command)
    for (int i = 0; i < 100; i++) {
        double x = (double)i / 50.0;
        double y = f_sequence.Get_y(x);
        double ydx = f_sequence.Get_y_dx(x);
        double ydxdx = f_sequence.Get_y_dxdx(x);
        file_f_sequence << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    //
    // EXAMPLE 5: a repeating sequence
    //

    GetLog() << "==== Test 5...\n\n";

    auto f_part1 = chrono_types::make_shared<ChFunction_Ramp>();
    f_part1->Set_ang(.50);
    auto f_part2 = chrono_types::make_shared<ChFunction_Const>();
    f_part2->Set_yconst(1.0);
    auto f_part3 = chrono_types::make_shared<ChFunction_Ramp>();
    f_part3->Set_ang(-.50);

    auto f_seq = chrono_types::make_shared<ChFunction_Sequence>();
    f_seq->InsertFunct(f_part1, 1.0, 1, true);
    f_seq->InsertFunct(f_part2, 1.0, 1., true);
    f_seq->InsertFunct(f_part3, 1.0, 1., true);

    auto f_rep_seq = chrono_types::make_shared<ChFunction_Repeat>();
    f_rep_seq->Set_fa(f_seq);
    f_rep_seq->Set_window_length(3.0);
    f_rep_seq->Set_window_start(0.0);
    f_rep_seq->Set_window_phase(3.0);

    std::string repeatfile = out_dir + "/f_repeat_out.dat";
    ChStreamOutAsciiFile file_f_repeat(repeatfile.c_str());
    for (int i = 0; i < 1000; i++) {
        double x = (double)i / 50.0;
        double y = f_rep_seq->Get_y(x);
        double ydx = f_rep_seq->Get_y_dx(x);
        double ydxdx = f_rep_seq->Get_y_dxdx(x);
        file_f_repeat << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    return 0;
}